

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

int wallet::TxStateSerializedIndex(TxState *state)

{
  long lVar1;
  __visit_result_t<util::Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:118:9)>,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
  _Var2;
  Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:118:9)>
  *in_RDI;
  long in_FS_OFFSET;
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = std::
          visit<util::Overloaded<wallet::TxStateSerializedIndex(std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&)::_lambda(wallet::TxStateInactive_const&)_1_,wallet::TxStateSerializedIndex(std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&)::_lambda(wallet::TxStateInMempool_const&)_1_,wallet::TxStateSerializedIndex(std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&)::_lambda(wallet::TxStateConfirmed_const&)_1_,wallet::TxStateSerializedIndex(std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&)::_lambda(wallet::TxStateBlockConflicted_const&)_1_,wallet::TxStateSerializedIndex(std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&)::_lambda(wallet::TxStateUnrecognized_const&)_1_>,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&>
                    (in_RDI,in_stack_ffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var2;
  }
  __stack_chk_fail();
}

Assistant:

static inline int TxStateSerializedIndex(const TxState& state)
{
    return std::visit(util::Overloaded{
        [](const TxStateInactive& inactive) { return inactive.abandoned ? -1 : 0; },
        [](const TxStateInMempool& in_mempool) { return 0; },
        [](const TxStateConfirmed& confirmed) { return confirmed.position_in_block; },
        [](const TxStateBlockConflicted& conflicted) { return -1; },
        [](const TxStateUnrecognized& unrecognized) { return unrecognized.index; }
    }, state);
}